

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O0

void __thiscall fasttext::FastText::FastText(FastText *this)

{
  nullptr_t in_RDI;
  unique_ptr<fasttext::DenseMatrix,_std::default_delete<fasttext::DenseMatrix>_> *this_00;
  nullptr_t pvVar1;
  
  pvVar1 = in_RDI;
  std::shared_ptr<fasttext::Args>::shared_ptr((shared_ptr<fasttext::Args> *)0x1a905f);
  this_00 = (unique_ptr<fasttext::DenseMatrix,_std::default_delete<fasttext::DenseMatrix>_> *)
            ((long)in_RDI + 0x10);
  std::shared_ptr<fasttext::Dictionary>::shared_ptr((shared_ptr<fasttext::Dictionary> *)0x1a9072);
  std::shared_ptr<fasttext::Matrix>::shared_ptr((shared_ptr<fasttext::Matrix> *)0x1a9085);
  std::shared_ptr<fasttext::Matrix>::shared_ptr((shared_ptr<fasttext::Matrix> *)0x1a9098);
  std::shared_ptr<fasttext::Model>::shared_ptr((shared_ptr<fasttext::Model> *)0x1a90ab);
  *(undefined8 *)((long)in_RDI + 0x50) = 0;
  *(undefined4 *)((long)in_RDI + 0x58) = 0;
  std::chrono::
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  ::time_point((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                *)this_00);
  *(undefined1 *)((long)pvVar1 + 0x68) = 0;
  std::unique_ptr<fasttext::DenseMatrix,std::default_delete<fasttext::DenseMatrix>>::
  unique_ptr<std::default_delete<fasttext::DenseMatrix>,void>(this_00,pvVar1);
  std::unique_ptr<fasttext::DenseMatrix,std::default_delete<fasttext::DenseMatrix>>::
  unique_ptr<std::default_delete<fasttext::DenseMatrix>,void>(this_00);
  std::__exception_ptr::exception_ptr::exception_ptr
            ((exception_ptr *)((long)pvVar1 + 0x80),(nullptr_t)0x0);
  return;
}

Assistant:

FastText::FastText()
    : quant_(false), wordVectors_(nullptr), trainException_(nullptr) {}